

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O1

string * __thiscall
anurbs::Entry<anurbs::BrepLoop>::key_abi_cxx11_
          (string *__return_storage_ptr__,Entry<anurbs::BrepLoop> *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_key)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string key() const override
    {
        return m_key;
    }